

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# densehashtable.h
# Opt level: O3

pointer __thiscall
google::
dense_hashtable<std::pair<const_int,_int>,_const_int,_Hasher,_google::dense_hash_map<const_int,_int,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SelectKey,_google::dense_hash_map<const_int,_int,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SetKey,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
::alloc_impl<google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::realloc_or_die
          (alloc_impl<google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_> *this,
          pointer ptr,size_type n)

{
  int iVar1;
  long lVar2;
  pointer ppVar3;
  int iVar4;
  int iVar5;
  
  ppVar3 = (pointer)realloc(ptr,n * 8);
  if (ppVar3 != (pointer)0x0) {
    return ppVar3;
  }
  dense_hashtable<std::pair<int_const,int>,int_const,Hasher,google::dense_hash_map<int_const,int,Hasher,Hasher,google::libc_allocator_with_realloc<std::pair<int_const,int>>>::SelectKey,google::dense_hash_map<int_const,int,Hasher,Hasher,google::libc_allocator_with_realloc<std::pair<int_const,int>>>::SetKey,Hasher,google::libc_allocator_with_realloc<std::pair<int_const,int>>>
  ::alloc_impl<google::libc_allocator_with_realloc<std::pair<int_const,int>>>::realloc_or_die();
  ppVar3 = *(pointer *)(n + 8);
  if (ppVar3 != *(pointer *)(n + 0x10)) {
    lVar2 = *(long *)n;
    iVar5 = *(int *)(lVar2 + 0x38);
    iVar1 = *(int *)(lVar2 + 0x40);
    do {
      iVar4 = iVar5 + 1;
      if ((iVar1 != ppVar3->first) &&
         ((*(long *)(lVar2 + 0x48) == 0 ||
          (iVar4 = iVar5 + 2, *(int *)(lVar2 + 0x3c) != ppVar3->first)))) break;
      iVar5 = iVar4;
      ppVar3 = ppVar3 + 1;
      *(pointer *)(n + 8) = ppVar3;
      iVar4 = iVar5;
    } while (ppVar3 != *(pointer *)(n + 0x10));
    *(int *)(lVar2 + 0x38) = iVar4;
  }
  return ppVar3;
}

Assistant:

pointer realloc_or_die(pointer ptr, size_type n) {
      pointer retval = this->reallocate(ptr, n);
      if (retval == NULL) {
        fprintf(stderr,
                "sparsehash: FATAL ERROR: failed to reallocate "
                "%lu elements for ptr %p",
                static_cast<unsigned long>(n), static_cast<void*>(ptr));
        exit(1);
      }
      return retval;
    }